

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O3

x86XmmReg __thiscall
CodeGenGenericContext::FindXmmRegAtMemory
          (CodeGenGenericContext *this,x86Size size,x86Reg index,int multiplier,x86Reg base,
          uint shift,bool checkRegisters)

{
  uint uVar1;
  x86Reg xVar2;
  int iVar3;
  x86Reg xVar4;
  uint uVar5;
  x86XmmReg xVar6;
  long lVar7;
  int *piVar8;
  x86Argument newArg;
  uint local_60;
  x86Reg local_5c;
  int local_58;
  x86Reg local_54;
  x86Argument local_50;
  
  local_60 = shift;
  local_5c = base;
  local_58 = multiplier;
  local_54 = index;
  RedirectAddressComputation(this,&local_54,&local_58,&local_5c,&local_60);
  xVar4 = local_54;
  iVar3 = local_58;
  xVar2 = local_5c;
  uVar1 = local_60;
  local_50.type = argPtr;
  local_50.ptrBase = local_5c;
  local_50.ptrIndex = local_54;
  local_50.ptrMult = local_58;
  local_50.ptrNum = local_60;
  local_50.field_1.ptrSize = size;
  uVar5 = MemFind(this,&local_50);
  if ((uVar5 == 0) || (this->memCache[uVar5 - 1].value.type != argXmmReg)) {
    xVar6 = rXmmRegCount;
    if (checkRegisters) {
      piVar8 = &this->xmmReg[0].ptrNum;
      lVar7 = 0;
      do {
        if ((((((x86Argument *)(piVar8 + -7))->type == argPtr) &&
             (((anon_union_8_6_73be8994_for_x86Argument_2 *)(piVar8 + -5))->reg == size)) &&
            (piVar8[-3] == xVar2)) &&
           (((piVar8[-2] == xVar4 && (piVar8[-1] == iVar3)) && (*piVar8 == uVar1)))) {
          return (x86XmmReg)lVar7;
        }
        lVar7 = lVar7 + 1;
        piVar8 = piVar8 + 8;
      } while (lVar7 != 0x10);
    }
  }
  else {
    xVar6 = this->memCache[uVar5 - 1].value.field_1.xmmArg;
  }
  return xVar6;
}

Assistant:

x86XmmReg CodeGenGenericContext::FindXmmRegAtMemory(x86Size size, x86Reg index, int multiplier, x86Reg base, unsigned shift, bool checkRegisters)
{
#ifdef NULLC_OPTIMIZE_X86
	RedirectAddressComputation(index, multiplier, base, shift);

	x86Argument newArg = x86Argument(size, index, multiplier, base, shift);

	if(unsigned memIndex = MemFind(newArg))
	{
		memIndex--;

		if(memCache[memIndex].value.type == x86Argument::argXmmReg)
			return memCache[memIndex].value.xmmArg;
	}

	if(checkRegisters)
	{
		// If another register contains data from memory
		for(unsigned i = 0; i < rXmmRegCount; i++)
		{
			if(xmmReg[i].type == x86Argument::argPtr && xmmReg[i] == newArg)
				return (x86XmmReg)i;
		}
	}
#endif

	return rXmmRegCount;
}